

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_Parsing_Test::
~ExtensionSetTest_Parsing_Test(ExtensionSetTest_Parsing_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExtensionSetTest, Parsing) {
  // Serialize as TestAllTypes and parse as TestAllExtensions.
  unittest::TestAllTypes source;
  unittest::TestAllExtensions destination;
  std::string data;

  TestUtil::SetAllFields(&source);
  source.SerializeToString(&data);
  EXPECT_TRUE(destination.ParseFromString(data));
  TestUtil::SetOneofFieldsExtensions(&destination);
  TestUtil::ExpectAllExtensionsSet(destination);
}